

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

void __thiscall
duckdb::PersistentColumnData::Serialize(PersistentColumnData *this,Serializer *serializer)

{
  bool bVar1;
  undefined8 uVar2;
  Serializer *in_RSI;
  Serializer *in_RDI;
  PersistentColumnData *in_stack_ffffffffffffff78;
  vector<duckdb::PersistentColumnData,_true> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  field_id_t field_id;
  Serializer *in_stack_ffffffffffffff90;
  Serializer *this_00;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  allocator *paVar3;
  field_id_t field_id_00;
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  field_id_00 = (field_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30);
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff88 >> 0x30);
  if (((in_RDI->options).serialization_compatibility.manually_set & 1U) == 0) {
    local_10 = in_RSI;
    Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::DataPointer,true>>
              (in_stack_ffffffffffffff90,field_id,(char *)in_stack_ffffffffffffff80,
               (vector<duckdb::DataPointer,_true> *)in_stack_ffffffffffffff78);
    bVar1 = ::std::
            vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
            empty((vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                   *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      this_00 = local_10;
      vector<duckdb::PersistentColumnData,_true>::operator[]
                (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      Serializer::WriteProperty<duckdb::PersistentColumnData>
                (this_00,field_id,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if ((*(char *)&in_RDI->_vptr_Serializer == '\x1d') ||
         (*(char *)&in_RDI->_vptr_Serializer == '\x17')) {
        vector<duckdb::PersistentColumnData,_true>::operator[]
                  (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
        Serializer::WriteProperty<duckdb::PersistentColumnData>
                  (this_00,local_10._6_2_,(char *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
      }
      else if (*(char *)&in_RDI->_vptr_Serializer == '\x18') {
        ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
        size((vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_> *)
             &(in_RDI->options).serialization_compatibility.duckdb_version.field_2);
        Serializer::
        WriteList<duckdb::PersistentColumnData::Serialize(duckdb::Serializer&)const::__0>
                  (in_RDI,field_id_00,in_stack_ffffffffffffff98,(idx_t)this_00,
                   (anon_class_8_1_8991fb9c)in_RDI);
      }
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  paVar3 = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"Column data with updates cannot be serialized",paVar3);
  InternalException::InternalException
            ((InternalException *)in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
  __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void PersistentColumnData::Serialize(Serializer &serializer) const {
	if (has_updates) {
		throw InternalException("Column data with updates cannot be serialized");
	}
	serializer.WritePropertyWithDefault(100, "data_pointers", pointers);
	if (child_columns.empty()) {
		// validity column
		D_ASSERT(physical_type == PhysicalType::BIT);
		return;
	}
	serializer.WriteProperty(101, "validity", child_columns[0]);
	if (physical_type == PhysicalType::ARRAY || physical_type == PhysicalType::LIST) {
		D_ASSERT(child_columns.size() == 2);
		serializer.WriteProperty(102, "child_column", child_columns[1]);
	} else if (physical_type == PhysicalType::STRUCT) {
		serializer.WriteList(102, "sub_columns", child_columns.size() - 1,
		                     [&](Serializer::List &list, idx_t i) { list.WriteElement(child_columns[i + 1]); });
	}
}